

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disabledtest.cpp
# Opt level: O0

void __thiscall
iu_TestDisabled_x_iutest_x_DISABLED_Test1_Test::Body
          (iu_TestDisabled_x_iutest_x_DISABLED_Test1_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_228;
  AssertionHelper local_208;
  Fixed local_1d8;
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_TestDisabled_x_iutest_x_DISABLED_Test1_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_39 = false;
  iutest::AssertionResult::Is<bool>((AssertionResult *)local_38,&local_39);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_228,(internal *)local_38,(AssertionResult *)"false","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/disabledtest.cpp"
               ,0x17,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

IUTEST(TestDisabled, DISABLED_Test1)
{
    // disable
    IUTEST_ASSERT_TRUE(false);
}